

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

bool __thiscall
tcmalloc::CentralFreeList::ShrinkCache(CentralFreeList *this,int locked_size_class,bool force)

{
  CentralFreeList *pCVar1;
  undefined1 local_30 [8];
  LockInverter li;
  bool force_local;
  int locked_size_class_local;
  CentralFreeList *this_local;
  
  if (this->cache_size_ == 0) {
    this_local._7_1_ = false;
  }
  else if ((force) || (this->used_slots_ != this->cache_size_)) {
    li.temp_._3_1_ = force;
    li.temp_._4_4_ = locked_size_class;
    pCVar1 = Static::central_cache();
    anon_unknown_7::LockInverter::LockInverter
              ((LockInverter *)local_30,&pCVar1[li.temp_._4_4_].lock_,&this->lock_);
    if (this->cache_size_ == 0) {
      this_local._7_1_ = false;
    }
    else if (this->used_slots_ == this->cache_size_) {
      if ((li.temp_._3_1_ & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this->cache_size_ = this->cache_size_ + -1;
        this->used_slots_ = this->used_slots_ + -1;
        ReleaseListToSpans(this,this->tc_slots_[this->used_slots_].head);
        this_local._7_1_ = true;
      }
    }
    else {
      this->cache_size_ = this->cache_size_ + -1;
      this_local._7_1_ = true;
    }
    anon_unknown_7::LockInverter::~LockInverter((LockInverter *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CentralFreeList::ShrinkCache(int locked_size_class, bool force)
    NO_THREAD_SAFETY_ANALYSIS {
  // Start with a quick check without taking a lock.
  if (cache_size_ == 0) return false;
  // We don't evict from a full cache unless we are 'forcing'.
  if (force == false && used_slots_ == cache_size_) return false;

  // Grab lock, but first release the other lock held by this thread.  We use
  // the lock inverter to ensure that we never hold two size class locks
  // concurrently.  That can create a deadlock because there is no well
  // defined nesting order.
  LockInverter li(&Static::central_cache()[locked_size_class].lock_, &lock_);
  ASSERT(used_slots_ <= cache_size_);
  ASSERT(0 <= cache_size_);
  if (cache_size_ == 0) return false;
  if (used_slots_ == cache_size_) {
    if (force == false) return false;
    // ReleaseListToSpans releases the lock, so we have to make all the
    // updates to the central list before calling it.
    cache_size_--;
    used_slots_--;
    ReleaseListToSpans(tc_slots_[used_slots_].head);
    return true;
  }
  cache_size_--;
  return true;
}